

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_interactor.cpp
# Opt level: O2

void animation_timer_method_proc(Am_Object *inter,Am_Time *elapsed_time)

{
  Am_Value *in_value;
  Am_Value value;
  Am_Value local_20;
  
  value.type = 0;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  in_value = Am_Object::Get(inter,0xc5,1);
  Am_Value::operator=(&value,in_value);
  Am_Value::Am_Value(&local_20,&value);
  call_all_commands(&local_20,200,inter,elapsed_time,false);
  Am_Value::~Am_Value(&local_20);
  Am_Value::~Am_Value(&value);
  return;
}

Assistant:

Am_Define_Method(Am_Timer_Method, void, animation_timer_method,
                 (Am_Object inter, const Am_Time &elapsed_time))
{
  Am_Value value;
  value = inter.Peek(Am_COMMAND);
  call_all_commands(value, Am_INTERIM_DO_METHOD, inter, elapsed_time, false);
}